

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

void __thiscall libsgp4::SGP4::Reset(SGP4 *this)

{
  SGP4 *this_local;
  
  this[0x2c8] = (SGP4)0x0;
  this[0x2c9] = (SGP4)0x0;
  memset(this,0,0x78);
  memset(this + 0x78,0,0x58);
  memset(this + 0xd0,0,0x180);
  memset(this + 0x250,0,0x18);
  return;
}

Assistant:

void SGP4::Reset()
{
    use_simple_model_ = false;
    use_deep_space_ = false;

    std::memset(&common_consts_, 0, sizeof(common_consts_));
    std::memset(&nearspace_consts_, 0, sizeof(nearspace_consts_));
    std::memset(&deepspace_consts_, 0, sizeof(deepspace_consts_));
    std::memset(&integrator_params_, 0, sizeof(integrator_params_));
}